

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerReflection::emit_specialization_constants(CompilerReflection *this)

{
  Stream *pSVar1;
  SPIRConstant *pSVar2;
  SPIRType *pSVar3;
  string *value;
  long lVar4;
  SpecializationConstant *pSVar5;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> specialization_constants;
  SPIRType type;
  allocator local_229;
  SPIRConstant *local_228;
  string local_220;
  long local_200;
  string local_1f8;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> local_1d8;
  SPIRType local_180;
  
  Compiler::get_specialization_constants(&local_1d8,(Compiler *)this);
  if (local_1d8.super_VectorView<spirv_cross::SpecializationConstant>.buffer_size != 0) {
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string
              ((string *)&local_180,"specialization_constants",(allocator *)&local_220);
    simple_json::Stream::emit_json_key_array(pSVar1,(string *)&local_180);
    ::std::__cxx11::string::~string((string *)&local_180);
    lVar4 = local_1d8.super_VectorView<spirv_cross::SpecializationConstant>.buffer_size << 3;
    pSVar5 = local_1d8.super_VectorView<spirv_cross::SpecializationConstant>.ptr;
    while (lVar4 != 0) {
      local_200 = lVar4;
      pSVar2 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,(pSVar5->id).id);
      pSVar3 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar2->super_IVariant).field_0xc);
      SPIRType::SPIRType(&local_180,pSVar3);
      local_228 = pSVar2;
      simple_json::Stream::begin_json_object
                ((this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_220,"name",(allocator *)&local_1f8);
      value = Compiler::get_name_abi_cxx11_((Compiler *)this,(ID)(pSVar5->id).id);
      simple_json::Stream::emit_json_key_value(pSVar1,&local_220,value);
      ::std::__cxx11::string::~string((string *)&local_220);
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_220,"id",(allocator *)&local_1f8);
      simple_json::Stream::emit_json_key_value(pSVar1,&local_220,pSVar5->constant_id);
      ::std::__cxx11::string::~string((string *)&local_220);
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_220,"type",&local_229);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_1f8,this,&local_180,0);
      simple_json::Stream::emit_json_key_value(pSVar1,&local_220,&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_220);
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_220,"variable_id",(allocator *)&local_1f8);
      simple_json::Stream::emit_json_key_value(pSVar1,&local_220,(pSVar5->id).id);
      ::std::__cxx11::string::~string((string *)&local_220);
      if (local_180.super_IVariant._12_4_ == 2) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&local_220,"default_value",(allocator *)&local_1f8)
        ;
        simple_json::Stream::emit_json_key_value
                  (pSVar1,&local_220,(local_228->m).c[0].r[0].u32 != 0);
LAB_002eb9a3:
        ::std::__cxx11::string::~string((string *)&local_220);
      }
      else {
        if (local_180.super_IVariant._12_4_ == 7) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__cxx11::string::string
                    ((string *)&local_220,"default_value",(allocator *)&local_1f8);
          simple_json::Stream::emit_json_key_value(pSVar1,&local_220,(local_228->m).c[0].r[0].i32);
          goto LAB_002eb9a3;
        }
        if (local_180.super_IVariant._12_4_ == 8) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__cxx11::string::string
                    ((string *)&local_220,"default_value",(allocator *)&local_1f8);
          simple_json::Stream::emit_json_key_value(pSVar1,&local_220,(local_228->m).c[0].r[0].u32);
          goto LAB_002eb9a3;
        }
        if (local_180.super_IVariant._12_4_ == 0xd) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__cxx11::string::string
                    ((string *)&local_220,"default_value",(allocator *)&local_1f8);
          simple_json::Stream::emit_json_key_value(pSVar1,&local_220,(local_228->m).c[0].r[0].f32);
          goto LAB_002eb9a3;
        }
      }
      simple_json::Stream::end_json_object
                ((this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      SPIRType::~SPIRType(&local_180);
      pSVar5 = pSVar5 + 1;
      lVar4 = local_200 + -8;
    }
    simple_json::Stream::end_json_array
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  SmallVector<spirv_cross::SpecializationConstant,_8UL>::~SmallVector(&local_1d8);
  return;
}

Assistant:

void CompilerReflection::emit_specialization_constants()
{
	auto specialization_constants = get_specialization_constants();
	if (specialization_constants.empty())
		return;

	json_stream->emit_json_key_array("specialization_constants");
	for (const auto &spec_const : specialization_constants)
	{
		auto &c = get<SPIRConstant>(spec_const.id);
		auto type = get<SPIRType>(c.constant_type);
		json_stream->begin_json_object();
		json_stream->emit_json_key_value("name", get_name(spec_const.id));
		json_stream->emit_json_key_value("id", spec_const.constant_id);
		json_stream->emit_json_key_value("type", type_to_glsl(type));
		json_stream->emit_json_key_value("variable_id", spec_const.id);
		switch (type.basetype)
		{
		case SPIRType::UInt:
			json_stream->emit_json_key_value("default_value", c.scalar());
			break;

		case SPIRType::Int:
			json_stream->emit_json_key_value("default_value", c.scalar_i32());
			break;

		case SPIRType::Float:
			json_stream->emit_json_key_value("default_value", c.scalar_f32());
			break;

		case SPIRType::Boolean:
			json_stream->emit_json_key_value("default_value", c.scalar() != 0);
			break;

		default:
			break;
		}
		json_stream->end_json_object();
	}
	json_stream->end_json_array();
}